

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  double local_28;
  
  pFVar3 = this->left_;
  pdVar8 = &(pFVar3->fadexpr_).expr_.defaultVal;
  if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar8 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  local_28 = -*pdVar8;
  dVar4 = sin((pFVar3->fadexpr_).expr_.val_);
  dVar1 = (this->right_->fadexpr_).left_.constant_;
  dVar5 = cos((((this->right_->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar3 = (this->right_->fadexpr_).right_;
  pdVar8 = &(pFVar3->fadexpr_).expr_.defaultVal;
  if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar8 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar2 = *pdVar8;
  dVar6 = sin((pFVar3->fadexpr_).expr_.val_);
  dVar7 = cos((this->left_->fadexpr_).expr_.val_);
  return (dVar5 + dVar1) * dVar4 * local_28 - dVar7 * dVar6 * dVar2;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}